

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

void printBits(char *c,half h)

{
  uint16_t uVar1;
  long in_RDI;
  int j;
  int i;
  unsigned_short b;
  undefined1 local_1d;
  int local_1c;
  int local_18;
  half local_2;
  
  uVar1 = Imath_3_1::half::bits(&local_2);
  local_1c = 0;
  for (local_18 = 0xf; -1 < local_18; local_18 = local_18 + -1) {
    local_1d = 0x31;
    if (((int)(uint)uVar1 >> ((byte)local_18 & 0x1f) & 1U) == 0) {
      local_1d = 0x30;
    }
    *(undefined1 *)(in_RDI + local_1c) = local_1d;
    if ((local_18 == 0xf) || (local_18 == 10)) {
      local_1c = local_1c + 1;
      *(undefined1 *)(in_RDI + local_1c) = 0x20;
    }
    local_1c = local_1c + 1;
  }
  *(undefined1 *)(in_RDI + 0x12) = 0;
  return;
}

Assistant:

IMATH_EXPORT void
printBits (char c[19], half h)
{
    unsigned short b = h.bits();

    for (int i = 15, j = 0; i >= 0; i--, j++)
    {
        c[j] = (((b >> i) & 1) ? '1' : '0');

        if (i == 15 || i == 10)
            c[++j] = ' ';
    }

    c[18] = 0;
}